

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData * Generate8KSectorTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  bool bVar1;
  Sector *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  BitBuffer *bitstream;
  Data data;
  BitstreamTrackBuilder bitbuf;
  
  bVar1 = Is8KSectorTrack(track);
  if (bVar1) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
    TrackBuilder::addGap(&bitbuf.super_TrackBuilder,0x10,-1);
    TrackBuilder::addIAM(&bitbuf.super_TrackBuilder);
    TrackBuilder::addGap(&bitbuf.super_TrackBuilder,0x10,-1);
    this = Track::operator[](track,0);
    TrackBuilder::addSectorUpToData(&bitbuf.super_TrackBuilder,&this->header,this->dam);
    __x = &Sector::data_copy(this,0)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__x);
    if (0x18a3 < (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0x18a3);
    }
    TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,&data);
    TrackBuilder::addGap
              (&bitbuf.super_TrackBuilder,
               ((int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start -
               (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) + 0x18a3,-1);
    bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    BitBuffer::~BitBuffer(&bitbuf.m_buffer);
    return __return_storage_ptr__;
  }
  __assert_fail("Is8KSectorTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x2ae,"TrackData Generate8KSectorTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData Generate8KSectorTrack(const CylHead& cylhead, const Track& track)
{
    assert(Is8KSectorTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addGap(16);  // gap 4a
    bitbuf.addIAM();
    bitbuf.addGap(16);  // gap 1

    auto& sector{ track[0] };
    bitbuf.addSectorUpToData(sector.header, sector.dam);

    // Maximum size of long-track version used by Coin-Op Hits
    static constexpr auto max_size{ 0x18a3 };
    auto data = sector.data_copy();
    if (data.size() > max_size)
        data.resize(max_size);

    bitbuf.addBlock(data);
    bitbuf.addGap(max_size - data.size());

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}